

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFabUtil.cpp
# Opt level: O1

void amrex::makeFineMask_doit<amrex::FArrayBox>
               (FabArray<amrex::FArrayBox> *mask,BoxArray *fba,IntVect *ratio,Periodicity *period,
               value_type_conflict2 crse_value,value_type_conflict2 fine_value)

{
  BaseFab<double> *this;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  pointer pIVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined8 uVar7;
  pointer pIVar8;
  FabArray<amrex::FArrayBox> *this_00;
  int *piVar9;
  long lVar10;
  int iVar11;
  IntVect *iv;
  uint uVar12;
  int i;
  ulong uVar13;
  long lVar14;
  pair<int,_amrex::Box> *is;
  pointer ppVar15;
  bool bVar16;
  int iVar18;
  undefined1 auVar17 [16];
  undefined1 auVar19 [16];
  int iVar20;
  Box r;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> isects;
  MFIter mfi;
  Box local_1d8;
  undefined1 local_1b8 [16];
  pointer local_1a8;
  Box local_194;
  vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> local_178;
  FabArray<amrex::FArrayBox> *local_160;
  value_type_conflict2 local_158;
  long local_150;
  ulong local_148;
  value_type_conflict2 local_140;
  MFIter local_138;
  Array4<double> local_d8;
  BoxArray local_98;
  
  local_158 = crse_value;
  local_140 = fine_value;
  coarsen(&local_98,fba,ratio);
  Periodicity::shiftIntVect(&local_178,period);
  local_1b8 = (undefined1  [16])0x0;
  local_1a8 = (pointer)0x0;
  MFIter::MFIter(&local_138,&mask->super_FabArrayBase,'\0');
  if (local_138.currentIndex < local_138.endIndex) {
    local_160 = mask;
    do {
      this_00 = local_160;
      FabArrayBase::fabbox
                (&local_194,local_138.fabArray,
                 ((local_138.index_map)->super_vector<int,_std::allocator<int>_>).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start[local_138.currentIndex]);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_d8,this_00,&local_138);
      pIVar8 = local_178.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl
               .super__Vector_impl_data._M_finish;
      auVar6 = _DAT_0077bb40;
      auVar5 = _DAT_0077bb30;
      piVar9 = &local_138.currentIndex;
      if (local_138.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        piVar9 = ((local_138.local_index_map)->super_vector<int,_std::allocator<int>_>).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start + local_138.currentIndex;
      }
      this = &(this_00->m_fabs_v).
              super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>._M_impl.
              super__Vector_impl_data._M_start[*piVar9]->super_BaseFab<double>;
      pIVar4 = local_178.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl
               .super__Vector_impl_data._M_start;
      if (local_194.smallend.vect[2] <= local_194.bigend.vect[2]) {
        local_148 = (ulong)(uint)local_194.bigend.vect[1];
        uVar12 = local_194.bigend.vect[0] - local_194.smallend.vect[0];
        auVar17._4_4_ = 0;
        auVar17._0_4_ = uVar12;
        auVar17._8_4_ = uVar12;
        auVar17._12_4_ = 0;
        local_150 = (long)local_194.smallend.vect[0] * 8;
        auVar17 = auVar17 ^ _DAT_0077bb40;
        iVar11 = local_194.smallend.vect[2];
        do {
          if (local_194.smallend.vect[1] <= local_194.bigend.vect[1]) {
            lVar14 = (long)local_d8.p +
                     ((long)local_194.smallend.vect[1] - (long)local_d8.begin.y) *
                     local_d8.jstride * 8 +
                     ((long)iVar11 - (long)local_d8.begin.z) * local_d8.kstride * 8 +
                     (long)local_d8.begin.x * -8 + local_150 + 8;
            lVar10 = (long)local_194.smallend.vect[1];
            do {
              if (local_194.smallend.vect[0] <= local_194.bigend.vect[0]) {
                uVar13 = 0;
                do {
                  auVar19._8_4_ = (int)uVar13;
                  auVar19._0_8_ = uVar13;
                  auVar19._12_4_ = (int)(uVar13 >> 0x20);
                  auVar19 = (auVar19 | auVar5) ^ auVar6;
                  bVar16 = auVar17._0_4_ < auVar19._0_4_;
                  iVar18 = auVar17._4_4_;
                  iVar20 = auVar19._4_4_;
                  if ((bool)(~(iVar18 < iVar20 || iVar20 == iVar18 && bVar16) & 1)) {
                    *(value_type_conflict2 *)(lVar14 + -8 + uVar13 * 8) = local_158;
                  }
                  if (iVar18 >= iVar20 && (iVar20 != iVar18 || !bVar16)) {
                    *(value_type_conflict2 *)(lVar14 + uVar13 * 8) = local_158;
                  }
                  uVar13 = uVar13 + 2;
                } while (((ulong)uVar12 + 2 & 0xfffffffffffffffe) != uVar13);
              }
              lVar10 = lVar10 + 1;
              lVar14 = lVar14 + local_d8.jstride * 8;
            } while (local_194.bigend.vect[1] + 1U != (int)lVar10);
          }
          bVar16 = iVar11 != local_194.bigend.vect[2];
          iVar11 = iVar11 + 1;
        } while (bVar16);
      }
      for (; pIVar4 != pIVar8; pIVar4 = pIVar4 + 1) {
        local_1d8.smallend.vect[0] = local_194.smallend.vect[0] + (int)*(undefined8 *)pIVar4->vect;
        local_1d8.smallend.vect[1] =
             local_194.smallend.vect[1] + (int)((ulong)*(undefined8 *)pIVar4->vect >> 0x20);
        local_1d8.smallend.vect[2] = local_194.smallend.vect[2] + pIVar4->vect[2];
        local_1d8.bigend.vect[0] = local_194.bigend.vect[0] + pIVar4->vect[0];
        local_1d8.bigend.vect[1] = local_194.bigend.vect[1] + pIVar4->vect[1];
        local_1d8.btype.itype = local_194.btype.itype;
        local_1d8.bigend.vect[2] = local_194.bigend.vect[2] + pIVar4->vect[2];
        BoxArray::intersections
                  (&local_98,&local_1d8,
                   (vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                    *)local_1b8);
        uVar7 = local_1b8._8_8_;
        for (ppVar15 = (pointer)local_1b8._0_8_; ppVar15 != (pointer)uVar7; ppVar15 = ppVar15 + 1) {
          uVar1 = *(undefined8 *)(ppVar15->second).smallend.vect;
          uVar2 = *(undefined8 *)((ppVar15->second).smallend.vect + 2);
          uVar3 = *(undefined8 *)((ppVar15->second).bigend.vect + 2);
          local_1d8.bigend.vect[1] =
               (int)((ulong)*(undefined8 *)(ppVar15->second).bigend.vect >> 0x20);
          local_1d8.smallend.vect[2] = (int)uVar2;
          local_1d8.bigend.vect[0] = (int)((ulong)uVar2 >> 0x20);
          local_1d8.smallend.vect[0] = (int)uVar1 - (int)*(undefined8 *)pIVar4->vect;
          local_1d8.smallend.vect[1] =
               (int)((ulong)uVar1 >> 0x20) - (int)((ulong)*(undefined8 *)pIVar4->vect >> 0x20);
          local_1d8.smallend.vect[2] = local_1d8.smallend.vect[2] - pIVar4->vect[2];
          local_1d8.bigend.vect[0] = local_1d8.bigend.vect[0] - pIVar4->vect[0];
          local_1d8.bigend.vect[1] = local_1d8.bigend.vect[1] - pIVar4->vect[1];
          local_1d8.bigend.vect[2] = (int)uVar3;
          local_1d8.btype.itype = (uint)((ulong)uVar3 >> 0x20);
          local_1d8.bigend.vect[2] = local_1d8.bigend.vect[2] - pIVar4->vect[2];
          BaseFab<double>::setVal<(amrex::RunOn)1>
                    (this,&local_140,&local_1d8,(DestComp)0x0,(NumComps)0x1);
        }
      }
      MFIter::operator++(&local_138);
    } while (local_138.currentIndex < local_138.endIndex);
  }
  MFIter::~MFIter(&local_138);
  if ((pointer)local_1b8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_1b8._0_8_,(long)local_1a8 - local_1b8._0_8_);
  }
  if (local_178.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_178.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_178.
                          super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_178.
                          super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  BoxArray::~BoxArray(&local_98);
  return;
}

Assistant:

void makeFineMask_doit (FabArray<FAB>& mask, const BoxArray& fba,
                            const IntVect& ratio, Periodicity const& period,
                            typename FAB::value_type crse_value,
                            typename FAB::value_type fine_value)
    {
        using value_type = typename FAB::value_type;

        Vector<Array4BoxTag<value_type> > tags;

        bool run_on_gpu = Gpu::inLaunchRegion();

        const BoxArray& cfba = amrex::coarsen(fba,ratio);
        const std::vector<IntVect>& pshifts = period.shiftIntVect();
#ifdef AMREX_USE_OMP
#pragma omp parallel if (!run_on_gpu)
#endif
        {
            std::vector <std::pair<int,Box> > isects;
            for (MFIter mfi(mask); mfi.isValid(); ++mfi)
            {
                const Box& bx = mfi.fabbox();
                Array4<value_type> const& arr = mask.array(mfi);
                auto& fab = mask[mfi];

                AMREX_HOST_DEVICE_PARALLEL_FOR_3D(bx, i, j, k,
                {
                    arr(i,j,k) = crse_value;
                });

                for (const auto& iv : pshifts) {
                    cfba.intersections(bx+iv, isects);
                    for (const auto& is : isects) {
                        Box const& b = is.second-iv;
                        if (run_on_gpu) {
                            tags.push_back({arr,b});
                        } else {
                            fab.template setVal<RunOn::Host>(fine_value, b);
                        }
                    }
                }
            }
        }

#ifdef AMREX_USE_GPU
        amrex::ParallelFor(tags, 1,
        [=] AMREX_GPU_DEVICE (int i, int j, int k, int n,
                              Array4BoxTag<value_type> const& tag) noexcept
        {
            tag.dfab(i,j,k,n) = fine_value;
        });
#endif
    }